

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::BasicResourceImage::RunIteration
          (BasicResourceImage *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  GLuint *textures;
  vec4 *pvVar1;
  float *pfVar2;
  pointer *ppVVar3;
  RenderTarget *pRVar4;
  bool bVar5;
  bool bVar6;
  int i;
  GLuint GVar7;
  GLint GVar8;
  uint width;
  int iVar9;
  long lVar10;
  ostream *poVar11;
  bool *compile_error;
  int i_1;
  uint height;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  uvec3 global_size;
  float local_1e4;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> display;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  ios_base local_138 [264];
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  global_size.m_data[2] = 0;
  global_size.m_data[0] = 0;
  global_size.m_data[1] = 0;
  lVar10 = 0;
  do {
    global_size.m_data[lVar10] = num_groups->m_data[lVar10] * param_1->m_data[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  std::__cxx11::stringstream::stringstream((stringstream *)&data);
  ppVVar3 = &data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ppVVar3,"\nlayout(local_size_x = ",0x17);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)ppVVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,", local_size_y = ",0x11);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,", local_size_z = ",0x11);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") in;\nlayout(rgba32f) coherent uniform image2D g_image1;\nlayout(rgba32f) uniform image2D g_image2;\nconst uvec3 kGlobalSize = uvec3("
             ,0x83);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ");\nvoid main() {\n  if (gl_GlobalInvocationID.x >= kGlobalSize.x || gl_GlobalInvocationID.y >= kGlobalSize.y) return;\n  vec4 color = vec4(gl_GlobalInvocationID.x + gl_GlobalInvocationID.y) / 255.0;\n  imageStore(g_image1, ivec2(gl_GlobalInvocationID), color);\n  vec4 c = imageLoad(g_image1, ivec2(gl_GlobalInvocationID));\n  imageStore(g_image2, ivec2(gl_GlobalInvocationID), c);\n}"
             ,0x17a);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&data);
  std::ios_base::~ios_base(local_138);
  GVar7 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,(string *)&display)
  ;
  this->m_program = GVar7;
  if (display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&display.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(display.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(display.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar6 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar6) {
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    GVar8 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_image1");
    glu::CallLogWrapper::glUniform1i(this_00,GVar8,0);
    GVar8 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_image2");
    glu::CallLogWrapper::glUniform1i(this_00,GVar8,1);
    glu::CallLogWrapper::glUseProgram(this_00,0);
    width = num_groups->m_data[0] * param_1->m_data[0];
    height = num_groups->m_data[1] * param_1->m_data[1];
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&data,(ulong)(num_groups->m_data[2] * param_1->m_data[2] * height * width),
               (allocator_type *)&display);
    textures = this->m_texture;
    if (this->m_texture[0] == 0) {
      glu::CallLogWrapper::glGenTextures(this_00,2,textures);
    }
    lVar10 = 0;
    do {
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,textures[lVar10]);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
      glu::CallLogWrapper::glTexImage2D
                (this_00,0xde1,0,0x8814,width,height,0,0x1908,0x1406,
                 data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    glu::CallLogWrapper::glBindImageTexture(this_00,0,*textures,0,'\0',0,0x88ba,0x8814);
    glu::CallLogWrapper::glBindImageTexture(this_00,1,this->m_texture[1],0,'\0',0,0x88b9,0x8814);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    if (dispatch_indirect) {
      if (this->m_dispatch_buffer == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,this->m_dispatch_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_groups,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    else {
      glu::CallLogWrapper::glDispatchCompute
                (this_00,num_groups->m_data[0],num_groups->m_data[1],num_groups->m_data[2]);
    }
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x20);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c1);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture[1]);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_draw_program);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
    glu::CallLogWrapper::glViewport(this_00,0,0,width,height);
    glu::CallLogWrapper::glDrawArraysInstanced(this_00,5,0,4,1);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&display,(long)(int)(height * width),(allocator_type *)&global_size);
    glu::CallLogWrapper::glReadPixels
              (this_00,0,0,width,height,0x1908,0x1406,
               display.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    bVar6 = (int)height < 1;
    if (0 < (int)height) {
      uVar13 = 0;
      do {
        if (0 < (int)width) {
          uVar12 = 0;
          do {
            pRVar4 = (this->super_ComputeShaderBase).renderTarget;
            if (((long)uVar13 < (long)pRVar4->m_height) && ((long)uVar12 < (long)pRVar4->m_width)) {
              lVar10 = 0;
              do {
                global_size.m_data[lVar10] = (uint)((float)((int)uVar13 + (int)uVar12) / 255.0);
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              iVar9 = width * (int)uVar13 + (int)uVar12;
              fVar14 = display.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar9].m_data[0] -
                       (float)global_size.m_data[0];
              fVar15 = -fVar14;
              if (-fVar14 <= fVar14) {
                fVar15 = fVar14;
              }
              pvVar1 = &(this->super_ComputeShaderBase).g_color_eps;
              if (pvVar1->m_data[0] <= fVar15 && fVar15 != pvVar1->m_data[0]) {
LAB_0091857b:
                bVar5 = false;
              }
              else {
                fVar14 = display.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar9].m_data[1] -
                         (float)global_size.m_data[1];
                fVar15 = -fVar14;
                if (-fVar14 <= fVar14) {
                  fVar15 = fVar14;
                }
                pfVar2 = (this->super_ComputeShaderBase).g_color_eps.m_data + 1;
                if (*pfVar2 <= fVar15 && fVar15 != *pfVar2) goto LAB_0091857b;
                fVar14 = display.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar9].m_data[2] -
                         (float)global_size.m_data[2];
                fVar15 = -fVar14;
                if (-fVar14 <= fVar14) {
                  fVar15 = fVar14;
                }
                pfVar2 = (this->super_ComputeShaderBase).g_color_eps.m_data + 2;
                if (*pfVar2 <= fVar15 && fVar15 != *pfVar2) goto LAB_0091857b;
                fVar14 = display.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar9].m_data[3] - local_1e4;
                fVar15 = -fVar14;
                if (-fVar14 <= fVar14) {
                  fVar15 = fVar14;
                }
                pfVar2 = (this->super_ComputeShaderBase).g_color_eps.m_data + 3;
                bVar5 = fVar15 < *pfVar2 || fVar15 == *pfVar2;
              }
              if (!bVar5) {
                anon_unknown_0::Output
                          ("Got %f, %f, %f, %f, expected %f, %f, %f, %f at %d, %d",
                           (double)display.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar9].m_data[0],
                           (double)display.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar9].m_data[1],
                           (double)display.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar9].m_data[2],
                           (double)display.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar9].m_data[3],
                           (double)(float)global_size.m_data[0],(double)(float)global_size.m_data[1]
                           ,(double)(float)global_size.m_data[2],(double)local_1e4,
                           uVar12 & 0xffffffff,uVar13 & 0xffffffff);
                goto LAB_0091862e;
              }
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != width);
        }
        uVar13 = uVar13 + 1;
        bVar6 = height <= uVar13;
      } while (uVar13 != height);
    }
LAB_0091862e:
    if (display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(display.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)display.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)display.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(data.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_image1"), 0);
		glUniform1i(glGetUniformLocation(m_program, "g_image2"), 1);
		glUseProgram(0);

		const GLint  kWidth  = static_cast<GLint>(local_size.x() * num_groups.x());
		const GLint  kHeight = static_cast<GLint>(local_size.y() * num_groups.y());
		const GLint  kDepth  = static_cast<GLint>(local_size.z() * num_groups.z());
		const GLuint kSize   = kWidth * kHeight * kDepth;

		std::vector<vec4> data(kSize);
		if (m_texture[0] == 0)
			glGenTextures(2, m_texture);

		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, m_texture[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, kWidth, kHeight, 0, GL_RGBA, GL_FLOAT, &data[0]);
		}
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindImageTexture(0, m_texture[0], 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glBindImageTexture(1, m_texture[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);
		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}
		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		glClear(GL_COLOR_BUFFER_BIT);
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_2D, m_texture[0]);
		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glUseProgram(m_draw_program);
		glBindVertexArray(m_vertex_array);
		glViewport(0, 0, kWidth, kHeight);
		glDrawArraysInstanced(GL_TRIANGLE_STRIP, 0, 4, 1);

		std::vector<vec4> display(kWidth * kHeight);
		glReadPixels(0, 0, kWidth, kHeight, GL_RGBA, GL_FLOAT, &display[0]);

		for (int y = 0; y < kHeight; ++y)
		{
			for (int x = 0; x < kWidth; ++x)
			{
				if (y >= getWindowHeight() || x >= getWindowWidth())
				{
					continue;
				}
				const vec4 c = vec4(float(y + x) / 255.0f);
				if (!ColorEqual(display[y * kWidth + x], c, g_color_eps))
				{
					Output("Got %f, %f, %f, %f, expected %f, %f, %f, %f at %d, %d", display[y * kWidth + x].x(),
						   display[y * kWidth + x].y(), display[y * kWidth + x].z(), display[y * kWidth + x].w(), c.x(),
						   c.y(), c.z(), c.w(), x, y);
					return false;
				}
			}
		}

		return true;
	}